

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void kratos::MergeWireAssignmentsVisitor::extract_sliced_stmts
               (StmtBlock *block,
               set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *sliced_stmts)

{
  pointer psVar1;
  pointer psVar2;
  undefined1 local_38 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  
  psVar2 = (block->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (block->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      if (((psVar2->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ ==
          Assign) {
        Stmt::as<kratos::AssignStmt>((Stmt *)local_38);
        if ((*(int *)(*(_func_int **)((long)local_38 + 0xc0) + 0x168) == 2) &&
           (*(int *)(*(_func_int **)((long)local_38 + 200) + 0x168) == 2)) {
          std::
          _Rb_tree<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::_Identity<std::shared_ptr<kratos::AssignStmt>>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
          ::_M_emplace_unique<std::shared_ptr<kratos::AssignStmt>&>
                    ((_Rb_tree<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::_Identity<std::shared_ptr<kratos::AssignStmt>>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                      *)sliced_stmts,(shared_ptr<kratos::AssignStmt> *)local_38);
        }
        if (assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
  }
  return;
}

Assistant:

static void extract_sliced_stmts(StmtBlock* block,
                                     std::set<std::shared_ptr<AssignStmt>>& sliced_stmts) {
        for (auto const& stmt : *block) {
            if (stmt->type() == StatementType ::Assign) {
                auto assign_stmt = stmt->as<AssignStmt>();
                if (assign_stmt->left()->type() == VarType::Slice &&
                    assign_stmt->right()->type() == VarType::Slice) {
                    sliced_stmts.emplace(assign_stmt);
                }
            }
        }
    }